

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::set_imputedstringvalue(Imputer *this,string *value)

{
  bool bVar1;
  string *psVar2;
  string *value_local;
  Imputer *this_local;
  
  bVar1 = has_imputedstringvalue(this);
  if (!bVar1) {
    clear_ImputedValue(this);
    set_has_imputedstringvalue(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
              (&(this->ImputedValue_).imputedstringvalue_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->ImputedValue_).imputedstringvalue_,psVar2,value);
  return;
}

Assistant:

inline void Imputer::set_imputedstringvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.Imputer.imputedStringValue)
  if (!has_imputedstringvalue()) {
    clear_ImputedValue();
    set_has_imputedstringvalue();
    ImputedValue_.imputedstringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  ImputedValue_.imputedstringvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.Imputer.imputedStringValue)
}